

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O1

void yatrie_get_word_nodes(word_nodes_s *res,uint8_t *word,uint32_t parent_id,trie_s *trie)

{
  uint uVar1;
  uint8_t uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  nodes_s *pnVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auStack_98 [8];
  uint8_t indexes [96];
  
  indexes._24_32_ = ZEXT1632(ZEXT816(0) << 0x40);
  _auStack_98 = ZEXT1632(ZEXT816(0) << 0x40);
  indexes._56_32_ = indexes._24_32_;
  encode_string(auStack_98,word);
  pnVar6 = trie->nodes;
  uVar2 = auStack_98[0];
  bVar3 = bit_int32_count(&pnVar6[(ulong)parent_id * 2 + 1].increment,'\x01',auStack_98[0] + 0xff);
  if (uVar2 != '\0') {
    uVar4 = (ulong)(&trie->refs[1].increment)[(uint)bVar3 + pnVar6[(ulong)parent_id * 2 + 2].size];
    pnVar6 = pnVar6 + uVar4 * 2 + 1;
    uVar5 = (ulong)res->length;
    indexes[0x58] = (char)uVar5;
    indexes[0x59] = (char)(uVar5 >> 8);
    indexes[0x5a] = (char)(uVar5 >> 0x10);
    indexes[0x5b] = (char)(uVar5 >> 0x18);
    indexes[0x5c] = (char)(uVar5 >> 0x20);
    indexes[0x5d] = (char)(uVar5 >> 0x28);
    indexes[0x5e] = (char)(uVar5 >> 0x30);
    indexes[0x5f] = (char)(uVar5 >> 0x38);
    uVar5 = 1;
    uVar8 = 0;
    do {
      uVar7 = uVar5;
      res->letters[uVar8] = -((pnVar6->increment & 1) == 0) | 1;
      res->length = (uint8_t)indexes._88_8_ + (char)uVar7;
      res->nodes[uVar8] = (uint32_t)uVar4;
      bVar3 = auStack_98[uVar7];
      uVar1 = (uint)bVar3;
      if ((bVar3 & 0x1f) == 0) {
        bVar3 = 0;
      }
      if (((&pnVar6->increment)[(int)(uVar1 - 1) >> 5] >> ((byte)(bVar3 - 1) & 0x1f) & 1) == 0) {
        return;
      }
      bVar3 = bit_int32_count(&pnVar6->increment,'\x01',(uint8_t)(uVar1 - 1));
      uVar4 = (ulong)(&trie->refs[1].increment)[(uint)bVar3 + pnVar6[1].size];
      pnVar6 = trie->nodes + uVar4 * 2 + 1;
      uVar5 = (ulong)((int)uVar7 + 1);
      uVar8 = uVar7;
    } while (auStack_98[uVar7] != '\0');
  }
  return;
}

Assistant:

void yatrie_get_word_nodes(word_nodes_s *res, uint8_t *word, uint32_t parent_id, trie_s *trie) {
    uint8_t indexes[MASK_BITS] = {}; //array to store bitmask
    uint32_t i = 0;
    uint8_t pos = 0;

    encode_string(indexes, word);
    node_s *parent_node = NODE_GET(parent_id, trie);

    //first node
    pos = bit_int32_count(parent_node->mask, 1, indexes[i++] - 1);
    parent_id = REF_GET(parent_node->ref_id, pos, trie);
    parent_node = NODE_GET(parent_id, trie);

    //cycle starts from the second node
    for (uint32_t j = 0; indexes[j]; ++i, ++j) {

        if(IS_LEAF(parent_node)){
            res->letters[j] = 1;
        } else {
            res->letters[j] = -1;
        }
        ++res->length;
        res->nodes[j] = parent_id;

        //if char exists in the bitmask we need to get next node_s id from the references block
        if (LIKELY(BIT_ARRAY_GET(parent_node->mask, indexes[i]))) {
            //number of chars (bits) before the current char (bit) position in the alphabet
            //count the number of bits before char to determine its position
            pos = bit_int32_count(parent_node->mask, 1, indexes[i] - 1);
            parent_id = REF_GET(parent_node->ref_id, pos, trie);
            parent_node = NODE_GET(parent_id, trie);
        } else {
            return;
        }

    }
    return;
}